

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O3

int __thiscall QUrlQueryPrivate::findRecodedKey(QUrlQueryPrivate *this,QString *key,int from)

{
  long lVar1;
  char16_t *pcVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  qsizetype *pqVar7;
  QStringView rhs;
  QStringView lhs;
  
  lVar1 = (this->itemList).d.size;
  lVar6 = (long)from;
  lVar5 = lVar1;
  if (lVar6 < lVar1) {
    pcVar2 = (key->d).ptr;
    lVar3 = (key->d).size;
    pqVar7 = &(this->itemList).d.ptr[lVar6].first.d.size;
    do {
      if ((*pqVar7 == lVar3) &&
         (rhs.m_data = pcVar2, rhs.m_size = lVar3, lhs.m_data = (char16_t *)pqVar7[-1],
         lhs.m_size = lVar3, bVar4 = QtPrivate::equalStrings(lhs,rhs), lVar5 = lVar6, bVar4)) break;
      lVar6 = lVar6 + 1;
      pqVar7 = pqVar7 + 6;
      lVar5 = lVar1;
    } while (lVar6 < lVar1);
  }
  return (int)lVar5;
}

Assistant:

int findRecodedKey(const QString &key, int from = 0) const
    {
        for (int i = from; i < itemList.size(); ++i)
            if (itemList.at(i).first == key)
                return i;
        return itemList.size();
    }